

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::Mat(Mat *this,int m,int n,double *a)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *local_50;
  int local_38;
  int i;
  double *a_local;
  int n_local;
  int m_local;
  Mat *this_local;
  
  this->n_rows_ = m;
  this->n_cols_ = n;
  if (m * n < 1) {
    local_50 = (double *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(m * n);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    local_50 = (double *)operator_new__(uVar2);
  }
  this->v_ = local_50;
  for (local_38 = 0; local_38 < m * n; local_38 = local_38 + 1) {
    this->v_[local_38] = *a;
  }
  return;
}

Assistant:

Mat::Mat(int m, int n, const double& a) : n_rows_(m), n_cols_(n),v_(m*n>0 ? new double[m*n] : NULL)
{
	for(int i=0; i<m*n; i++) v_[i] = a;
}